

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O2

void __thiscall Knn::run(Knn *this)

{
  priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
  *this_00;
  double *pdVar1;
  KdtreeNode *pKVar2;
  KdtreeNode *pKVar3;
  ostream *poVar4;
  double *c;
  double *pdVar5;
  allocator local_61;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  float local_50 [8];
  
  std::__cxx11::string::string((string *)local_50,"../data/perceptrondata.txt",&local_61);
  (**(this->super_Base)._vptr_Base)(this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  local_50[0] = 0.6;
  createTrainTest(this,local_50);
  createSplitAxis(this);
  setRoot(this);
  pKVar2 = buildTree(this,this->root,&this->root->leftTreeVal,&this->axisVec);
  pKVar3 = this->root;
  pKVar3->left = pKVar2;
  pKVar3 = buildTree(this,pKVar3,&pKVar3->rightTreeVal,&this->axisVec);
  this->root->right = pKVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"show the tree in preorder traversal.");
  std::endl<char,std::char_traits<char>>(poVar4);
  showTree(this,this->root);
  this->K = 2;
  local_60 = (this->super_Base).testData.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->maxHeap;
  for (local_58 = (this->super_Base).testData.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_58 != local_60;
      local_58 = local_58 + 1) {
    findKNearest(this,local_58);
    while (*(long *)&this->maxHeap != *(long *)&this->field_0x120) {
      std::operator<<((ostream *)&std::cout,"dis: ");
      std::ostream::_M_insert<double>(**(double **)this_00);
      std::operator<<((ostream *)&std::cout," val: ");
      pdVar1 = (double *)(*(undefined8 **)(*(long *)this_00 + 8))[1];
      for (pdVar5 = (double *)**(undefined8 **)(*(long *)this_00 + 8); pdVar5 != pdVar1;
          pdVar5 = pdVar5 + 1) {
        poVar4 = std::ostream::_M_insert<double>(*pdVar5);
        std::operator<<(poVar4," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::
      priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
      ::pop(this_00);
    }
  }
  return;
}

Assistant:

void Knn::run(){
    getData("../data/perceptrondata.txt");
    createTrainTest(0.6);
    createSplitAxis();
    setRoot();
    root->left = buildTree(root, root->leftTreeVal, axisVec);
    root->right = buildTree(root, root->rightTreeVal, axisVec);
    cout<<"show the tree in preorder traversal."<<endl;
    showTree(root);
    setK(2);
    for(auto& a:testData) {
        findKNearest(a);
        while (!maxHeap.empty()) {
            cout << "dis: " << maxHeap.top().first;
            cout << " val: ";
            for (auto &c :maxHeap.top().second->val)
                cout << c << " ";
            cout << endl;
            maxHeap.pop();
        }
    }
}